

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O3

void gai_gatscat_new(int op,Integer g_a,void *v,void *subscript,Integer c_flag,Integer nv,
                    double *locbytes,double *totbytes,void *alpha)

{
  short *psVar1;
  short sVar2;
  Integer IVar3;
  Integer *pIVar4;
  long lVar5;
  logical lVar6;
  long lVar7;
  ulong uVar8;
  long *plVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  int op_00;
  long lVar16;
  char *string;
  long lVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  void **ppvVar22;
  global_array_t *pgVar23;
  bool bVar24;
  Integer tproc;
  armci_giov_t desc;
  Integer index [7];
  Integer _lo [7];
  Integer _hi [7];
  Integer lo [7];
  Integer ld [6];
  Integer _index2 [7];
  Integer hi [7];
  long local_388;
  long local_380;
  void **local_378;
  int local_36c;
  void **local_368;
  long local_360;
  Integer *local_358;
  Integer local_350;
  long local_348;
  Integer local_340;
  int local_334;
  int local_330;
  int local_32c;
  Integer *local_328;
  Integer *local_320;
  ulong local_318;
  Integer local_310;
  void *local_308;
  armci_giov_t local_300;
  Integer local_2e8;
  long local_2e0;
  long local_2d8;
  long local_2d0;
  long local_2c8;
  long local_2c0;
  long local_2b8 [7];
  long local_280;
  long local_278;
  long local_270;
  Integer local_268;
  void *local_260;
  long local_258 [8];
  long local_218 [8];
  Integer local_1d8 [8];
  Integer local_198 [6];
  long local_168 [32];
  Integer local_68 [7];
  
  lVar21 = g_a + 1000;
  local_378 = (void **)nv;
  local_330 = op;
  local_308 = subscript;
  local_260 = v;
  local_350 = pnga_nodeid();
  pgVar23 = GA;
  local_380 = lVar21 * 0x368;
  local_2c8 = GA[lVar21].num_rstrctd;
  lVar21 = (long)GA[lVar21].p_handle;
  if (lVar21 < 0) {
    lVar10 = local_2c8;
    if (local_2c8 < 1) {
      lVar10 = GAnproc;
    }
  }
  else {
    lVar10 = (long)PGRP_LIST[lVar21].map_nproc;
  }
  lVar14 = (long)GA_prealloc_gatscat;
  local_310 = g_a;
  if (lVar14 == 0) {
    pIVar4 = (Integer *)pnga_malloc(lVar10,0x3f2,"ga_gat_header");
    ppvVar22 = local_378;
    local_320 = (Integer *)pnga_malloc((Integer)local_378,0x3f2,"ga_gat_list");
    local_358 = (Integer *)pnga_malloc(lVar10,0x3f2,"ga_gat_nelems");
  }
  else {
    if (lVar14 < (long)local_378) {
      pnga_error("Gather/scatter vector exceeds allocation length ",lVar14);
    }
    local_320 = GA_list;
    local_358 = GA_elems;
    pIVar4 = GA_header;
    ppvVar22 = local_378;
  }
  lVar14 = local_380;
  uVar13 = (uint)*(short *)((long)GA->dims + local_380 + -0x30);
  local_318 = (ulong)uVar13;
  local_360 = (long)(int)uVar13;
  local_2d8 = (long)*(int *)((long)GA->dims + local_380 + -0x2c);
  local_334 = *(int *)((long)GA->dims + local_380 + -0x18);
  local_2e0 = (long)local_334;
  *totbytes = (double)(local_2e0 * (long)ppvVar22);
  if (0 < lVar10) {
    lVar5 = 0;
    do {
      local_358[lVar5] = 0;
      pIVar4[lVar5] = -1;
      lVar5 = lVar5 + 1;
    } while (lVar10 != lVar5);
  }
  local_328 = pIVar4;
  local_2e8 = lVar10;
  local_278 = lVar21;
  if ((long)ppvVar22 < 1) {
    iVar12 = 1;
  }
  else {
    lVar21 = 0;
    memset(local_320,0,(long)ppvVar22 * 8);
    uVar11 = local_318 & 0xffffffff;
    local_348 = local_310 * 0x368 + 0xd50a8;
    local_368 = (void **)(local_310 * 0x368 + 0xd4ee0);
    iVar12 = 1;
    do {
      if (c_flag == 0) {
        pIVar4 = (Integer *)((long)local_308 + lVar21 * local_360 * 8);
      }
      else {
        pIVar4 = local_2b8;
        if (0 < (short)local_360) {
          lVar10 = *(long *)((long)local_308 + lVar21 * 8);
          plVar9 = local_2b8;
          lVar5 = local_360;
          do {
            *plVar9 = (long)*(int *)(lVar10 + -4 + lVar5 * 4) + 1;
            plVar9 = plVar9 + 1;
            lVar5 = lVar5 + -1;
          } while (lVar5 != 0);
          pIVar4 = local_2b8;
        }
      }
      lVar6 = pnga_locate(local_310,pIVar4,&local_388);
      if (lVar6 == 0) {
        gai_print_subscript("invalid subscript",(int)local_318,pIVar4,"\n");
        pnga_error("failed -element:",lVar21);
      }
      if (0 < local_2c8) {
        local_388 = *(long *)(*(long *)((long)GA->old_nblock + local_380 + -0x18) + local_388 * 8);
      }
      psVar1 = (short *)((long)GA->dims + local_380 + -0x30);
      iVar18 = *(int *)((long)GA->block_dims + local_380 + -4);
      if (iVar18 - 3U < 2) {
        sVar2 = *psVar1;
        uVar13 = (uint)sVar2;
        lVar10 = (long)(int)local_388 % *(long *)(psVar1 + 0x130);
        local_2b8[0] = lVar10;
        if (1 < (int)uVar13) {
          lVar5 = 0;
          do {
            local_388 = ((int)local_388 - lVar10) /
                        *(long *)((long)GA->dims + lVar5 * 8 + local_348 + -0x38);
            lVar10 = (long)(int)local_388 %
                     *(long *)((long)GA->dims + lVar5 * 8 + local_348 + -0x30);
            local_2b8[lVar5 + 1] = lVar10;
            lVar5 = lVar5 + 1;
          } while ((ulong)uVar13 - 1 != lVar5);
        }
        if (0 < (short)local_360) {
          uVar8 = 0;
          do {
            local_2b8[uVar8] =
                 local_2b8[uVar8] % (long)*(int *)((long)pgVar23->nblock + uVar8 * 4 + lVar14);
            uVar8 = uVar8 + 1;
          } while (uVar11 != uVar8);
        }
        lVar10 = (long)(int)uVar13;
        if (sVar2 < 1) {
LAB_00180966:
          local_388 = local_168[lVar10 + -1];
        }
        else {
          uVar8 = 0;
          do {
            local_168[uVar8] =
                 local_2b8[uVar8] %
                 (long)*(int *)((long)local_368 + (long)GA->dims + uVar8 * 4 + -0x30);
            uVar8 = uVar8 + 1;
          } while (uVar13 != uVar8);
          local_388 = local_168[lVar10 + -1];
          if (1 < sVar2) {
            uVar8 = (ulong)(uVar13 - 2);
            do {
              local_388 = local_388 * *(int *)((long)local_368 + (long)GA->dims + uVar8 * 4 + -0x30)
                          + local_168[uVar8];
              bVar24 = uVar8 != 0;
              uVar8 = uVar8 - 1;
            } while (bVar24);
          }
        }
      }
      else if (iVar18 == 1) {
        local_388 = local_388 % local_2e8;
      }
      else if (iVar18 == 2) {
        sVar2 = *psVar1;
        uVar13 = (uint)sVar2;
        lVar10 = (long)(int)local_388 % *(long *)(psVar1 + 0x130);
        local_2b8[0] = lVar10;
        if (1 < (int)uVar13) {
          lVar5 = 0;
          do {
            local_388 = ((int)local_388 - lVar10) /
                        *(long *)((long)GA->dims + lVar5 * 8 + local_348 + -0x38);
            lVar10 = (long)(int)local_388 %
                     *(long *)((long)GA->dims + lVar5 * 8 + local_348 + -0x30);
            local_2b8[lVar5 + 1] = lVar10;
            lVar5 = lVar5 + 1;
          } while ((ulong)uVar13 - 1 != lVar5);
        }
        if (0 < (short)local_360) {
          uVar8 = 0;
          do {
            local_2b8[uVar8] =
                 local_2b8[uVar8] % (long)*(int *)((long)pgVar23->nblock + uVar8 * 4 + lVar14);
            uVar8 = uVar8 + 1;
          } while (uVar11 != uVar8);
        }
        lVar10 = (long)(int)uVar13;
        if (sVar2 < 1) goto LAB_00180966;
        uVar8 = 0;
        do {
          local_168[uVar8] =
               local_2b8[uVar8] %
               (long)*(int *)((long)local_368 + (long)GA->dims + uVar8 * 4 + -0x30);
          uVar8 = uVar8 + 1;
        } while (uVar13 != uVar8);
        local_388 = local_168[lVar10 + -1];
        if (1 < sVar2) {
          uVar8 = (ulong)(uVar13 - 2);
          do {
            local_388 = local_388 * *(int *)((long)local_368 + (long)GA->dims + uVar8 * 4 + -0x30) +
                        local_168[uVar8];
            bVar24 = uVar8 != 0;
            uVar8 = uVar8 - 1;
          } while (bVar24);
        }
      }
      local_358[local_388] = local_358[local_388] + 1;
      if ((long)iVar12 < local_358[local_388]) {
        iVar12 = (int)local_358[local_388];
      }
      IVar3 = local_328[local_388];
      local_328[local_388] = lVar21;
      local_320[lVar21] = (long)(int)IVar3;
      lVar21 = lVar21 + 1;
    } while ((void **)lVar21 != local_378);
  }
  *locbytes = (double)(local_358[local_350] * local_2e0);
  local_378 = (void **)malloc((long)(iVar12 * 2) << 3);
  if (0 < local_2e8) {
    local_368 = local_378 + iVar12;
    iVar12 = (int)local_318;
    local_280 = (long)local_330;
    local_2d0 = local_310 * 0x368;
    local_2c0 = local_2d0 + 0xd4ee0;
    local_270 = local_2d0 + 0xd4f00;
    lVar21 = 0;
    local_268 = c_flag;
    lVar10 = local_380;
    lVar14 = local_360;
    do {
      if (0 < local_358[lVar21]) {
        local_388 = local_328[lVar21];
        if (-1 < local_388) {
          lVar5 = 0;
          local_348 = lVar21;
          do {
            IVar3 = local_310;
            pgVar23 = GA;
            if (c_flag == 0) {
              pIVar4 = (Integer *)((long)local_308 + local_388 * lVar14 * 8);
            }
            else {
              pIVar4 = local_2b8;
              if (0 < (short)lVar14) {
                lVar17 = *(long *)((long)local_308 + local_388 * 8);
                plVar9 = local_2b8;
                do {
                  *plVar9 = (long)*(int *)(lVar17 + -4 + lVar14 * 4) + 1;
                  plVar9 = plVar9 + 1;
                  lVar14 = lVar14 + -1;
                } while (lVar14 != 0);
                pIVar4 = local_2b8;
              }
            }
            if (*(int *)((long)GA->block_dims + lVar10 + -4) == 0) {
              lVar14 = (long)GA->dims + lVar10 + -0x30;
              sVar2 = *(short *)((long)GA->dims + lVar10 + -0x30);
              lVar20 = (long)sVar2;
              lVar17 = lVar20 + -1;
              lVar7 = *(long *)((long)GA->old_nblock + lVar10 + -0x30);
              local_340 = lVar21;
              if (lVar7 == 0) {
                if (0 < sVar2) {
                  lVar7 = 1;
                  lVar15 = 0;
                  do {
                    lVar7 = lVar7 * *(int *)((long)GA->dims + lVar15 * 4 + local_2c0 + -0x30);
                    lVar15 = lVar15 + 1;
                  } while (lVar20 != lVar15);
                  if (lVar7 <= lVar21) goto LAB_00180dce;
                  if (0 < sVar2) {
                    lVar10 = *(long *)(lVar14 + 0x1e8);
                    lVar7 = 0;
                    lVar15 = 0;
                    do {
                      lVar19 = (long)*(int *)((long)GA[1000].nblock + lVar15 * 4 + local_2d0);
                      lVar16 = lVar10 + (lVar21 % lVar19) * 8;
                      local_258[lVar15] = *(long *)(lVar16 + lVar7 * 8);
                      if (lVar21 % lVar19 == lVar19 + -1) {
                        lVar16 = *(long *)((long)GA[1000].dims + lVar15 * 8 + local_2d0);
                      }
                      else {
                        lVar16 = *(long *)(lVar16 + 8 + lVar7 * 8) + -1;
                      }
                      lVar7 = lVar7 + lVar19;
                      local_218[lVar15] = lVar16;
                      lVar15 = lVar15 + 1;
                      lVar21 = lVar21 / lVar19;
                    } while (lVar20 != lVar15);
LAB_00180db0:
                    iVar18 = *(int *)((long)GA->block_dims + local_380 + -0x18);
                    local_350 = lVar17;
                    if (0 < sVar2) goto LAB_00180e1d;
                    lVar7 = 1;
                    lVar15 = 0;
                    lVar10 = local_380;
                    lVar21 = local_348;
                    goto LAB_00180f16;
                  }
                }
LAB_00180eef:
                lVar7 = 1;
                lVar15 = 0;
                iVar18 = *(int *)((long)GA->block_dims + lVar10 + -0x18);
              }
              else {
                if (lVar21 < lVar7) {
                  if (0 < sVar2) {
                    lVar7 = 1;
                    lVar15 = 0;
                    do {
                      lVar7 = lVar7 * *(int *)((long)GA->dims + lVar15 * 4 + local_2c0 + -0x30);
                      lVar15 = lVar15 + 1;
                    } while (lVar20 != lVar15);
                    if (lVar7 <= lVar21) goto LAB_00180dce;
                    if (0 < sVar2) {
                      lVar10 = *(long *)(lVar14 + 0x1e8);
                      lVar7 = 0;
                      lVar15 = 0;
                      do {
                        lVar19 = (long)*(int *)((long)GA[1000].nblock + lVar15 * 4 + local_2d0);
                        lVar16 = lVar10 + (lVar21 % lVar19) * 8;
                        local_258[lVar15] = *(long *)(lVar16 + lVar7 * 8);
                        if (lVar21 % lVar19 == lVar19 + -1) {
                          lVar16 = *(long *)((long)GA[1000].dims + lVar15 * 8 + local_2d0);
                        }
                        else {
                          lVar16 = *(long *)(lVar16 + 8 + lVar7 * 8) + -1;
                        }
                        lVar7 = lVar7 + lVar19;
                        local_218[lVar15] = lVar16;
                        lVar15 = lVar15 + 1;
                        lVar21 = lVar21 / lVar19;
                      } while (lVar20 != lVar15);
                      goto LAB_00180db0;
                    }
                  }
                  goto LAB_00180eef;
                }
LAB_00180dce:
                if (sVar2 < 1) goto LAB_00180eef;
                local_350 = lVar17;
                memset(local_258,0,lVar20 * 8);
                memset(local_218,0xff,lVar20 * 8);
                iVar18 = *(int *)((long)pgVar23->block_dims + local_380 + -0x18);
LAB_00180e1d:
                local_32c = iVar18;
                lVar21 = 0;
                lVar10 = local_380;
                do {
                  if ((pIVar4[lVar21] < local_258[lVar21]) || (local_218[lVar21] < pIVar4[lVar21]))
                  {
                    sprintf((char *)local_168,"check subscript failed:%ld not in (%ld:%ld) dim=%d");
                    pnga_error((char *)local_168,lVar21);
                    lVar10 = local_380;
                    pgVar23 = GA;
                  }
                  lVar21 = lVar21 + 1;
                } while (lVar21 < *(short *)((long)pgVar23->dims + lVar10 + -0x30));
                lVar14 = (long)pgVar23->dims + lVar10 + -0x30;
                lVar17 = local_350;
                lVar21 = local_348;
                iVar18 = local_32c;
                if (sVar2 < 2) {
                  lVar7 = 1;
                  lVar15 = 0;
                }
                else {
                  lVar7 = 1;
                  lVar16 = 0;
                  lVar15 = 0;
                  do {
                    lVar19 = *(long *)((long)pgVar23->dims + lVar16 * 8 + local_270 + -0x30);
                    lVar15 = lVar15 + ((lVar19 + pIVar4[lVar16]) - local_258[lVar16]) * lVar7;
                    lVar7 = (((lVar19 * 2 + 1) - local_258[lVar16]) + local_218[lVar16]) * lVar7;
                    lVar16 = lVar16 + 1;
                  } while (local_350 != lVar16);
                }
              }
LAB_00180f16:
              lVar16 = lVar21;
              if (iVar18 == 0) {
                lVar16 = (long)PGRP_LIST->inv_map_proc_list[lVar21];
              }
              if (0 < *(long *)(lVar14 + 0x2a8)) {
                lVar16 = *(long *)(*(long *)(lVar14 + 0x2a0) + lVar16 * 8);
              }
              local_368[lVar5] =
                   (void *)((long)*(int *)(lVar14 + 0x18) *
                            (((pIVar4[lVar20 + -1] - local_258[lVar20 + -1]) +
                             *(long *)((long)pgVar23->width + lVar17 * 8 + lVar10)) * lVar7 + lVar15
                            ) + *(long *)(*(long *)(lVar14 + 0x1e0) + lVar16 * 8));
              c_flag = local_268;
            }
            else {
              lVar6 = pnga_locate(local_310,pIVar4,&local_340);
              if (lVar6 == 0) {
                gai_print_subscript("invalid subscript for block-cyclic array",(int)local_318,pIVar4
                                    ,"\n");
                pnga_error("failed -element:",local_388);
              }
              pnga_distribution(IVar3,local_340,local_1d8,local_68);
              ppvVar22 = local_368 + lVar5;
              pnga_access_block_ptr(IVar3,local_340,ppvVar22,local_198);
              lVar21 = 1;
              if ((short)local_360 < 2) {
                lVar10 = 0;
              }
              else {
                uVar11 = 0;
                lVar10 = 0;
                do {
                  lVar10 = lVar10 + (pIVar4[uVar11] - local_1d8[uVar11]) * lVar21;
                  lVar21 = lVar21 * local_198[uVar11];
                  uVar11 = uVar11 + 1;
                } while (iVar12 - 1 != uVar11);
              }
              *ppvVar22 = (void *)((long)*ppvVar22 +
                                  ((pIVar4[local_360 + -1] - local_1d8[local_360 + -1]) * lVar21 +
                                  lVar10) * local_2e0);
              lVar10 = local_380;
              lVar21 = local_348;
            }
            local_378[lVar5] = (void *)(local_388 * local_2e0 + (long)local_260);
            local_388 = local_320[local_388];
            lVar5 = lVar5 + 1;
            lVar14 = local_360;
          } while (-1 < local_388);
        }
        if (local_2c8 < 1) {
          local_340 = lVar21;
          if (-1 < (int)local_278) {
            local_340 = (long)PGRP_LIST[local_278].inv_map_proc_list[lVar21];
          }
        }
        else {
          local_340 = *(long *)(*(long *)((long)GA->old_nblock + lVar10 + -0x38) + lVar21 * 8);
        }
        iVar18 = (int)local_340;
        if (local_330 == -99) {
          local_300.bytes = local_334;
          local_300.src_ptr_array = local_378;
          local_300.dst_ptr_array = local_368;
          local_300.ptr_array_len = (int)local_358[lVar21];
          local_36c = ARMCI_PutV(&local_300,1,iVar18);
          if (local_36c == 0) {
LAB_001811aa:
            local_36c = 0;
            lVar10 = local_380;
            goto LAB_00181230;
          }
          lVar10 = (long)local_36c;
          string = "scatter failed in armci";
        }
        else if (local_330 == -0x61) {
          local_300.bytes = local_334;
          local_300.src_ptr_array = local_378;
          local_300.dst_ptr_array = local_368;
          local_300.ptr_array_len = (int)local_358[lVar21];
          if (alpha != (void *)0x0) {
            switch((int)local_2d8) {
            case 0x3e9:
              op_00 = 0x25;
              break;
            case 0x3ea:
              op_00 = 0x2a;
              break;
            case 0x3eb:
              op_00 = 0x27;
              break;
            case 0x3ec:
              op_00 = 0x26;
              break;
            default:
              pnga_error("type not supported",local_2d8);
              op_00 = -1;
              iVar18 = (int)local_340;
              break;
            case 0x3ee:
              op_00 = 0x28;
              break;
            case 0x3ef:
              op_00 = 0x29;
            }
            local_36c = ARMCI_AccV(op_00,alpha,&local_300,1,iVar18);
            lVar10 = local_380;
          }
          if (local_36c == 0) {
            local_36c = 0;
            goto LAB_00181230;
          }
          lVar10 = (long)local_36c;
          string = "scatter_acc failed in armci";
        }
        else if (local_330 == -0x62) {
          local_300.bytes = local_334;
          local_300.src_ptr_array = local_368;
          local_300.dst_ptr_array = local_378;
          local_300.ptr_array_len = (int)local_358[lVar21];
          local_36c = ARMCI_GetV(&local_300,1,iVar18);
          if (local_36c == 0) goto LAB_001811aa;
          string = "gather failed in armci";
          lVar10 = (long)local_36c;
        }
        else {
          string = "operation not supported";
          lVar10 = local_280;
        }
        pnga_error(string,lVar10);
        lVar10 = local_380;
      }
LAB_00181230:
      lVar21 = lVar21 + 1;
    } while (lVar21 != local_2e8);
  }
  free(local_378);
  if (GA_prealloc_gatscat == 0) {
    pnga_free(local_358);
    pnga_free(local_320);
    pnga_free(local_328);
  }
  return;
}

Assistant:

void gai_gatscat_new(int op, Integer g_a, void* v, void *subscript,
                     Integer c_flag, Integer nv, double *locbytes,
                     double* totbytes, void *alpha)
{
    Integer handle=g_a+GA_OFFSET;
    int  ndim, i, j, k, type, item_size;
    Integer idx, p_handle, num_rstrctd;
    Integer *proc;
    Integer nprocs, me, iproc, tproc, index[MAXDIM];
    Integer lo[MAXDIM], hi[MAXDIM], ld[MAXDIM-1];
    Integer jtot, last, offset;
    Integer *subscript_ptr;

    Integer *header, *list, *nelems;
    char *buf;
    void **ptr_rem, **ptr_loc; 
    int rc, maxlen;
    int *nblock;
    armci_giov_t desc;

    

    me = pnga_nodeid();
    num_rstrctd = GA[handle].num_rstrctd;
    nblock = GA[handle].nblock;

    /* determine how many processors are associated with array */
    p_handle = GA[handle].p_handle;
    if (p_handle < 0) {
      nprocs = GAnproc;
      if (num_rstrctd > 0) nprocs = num_rstrctd;
    } else {
      nprocs = PGRP_LIST[p_handle].map_nproc;
    }

    if (!GA_prealloc_gatscat) {
      header =(Integer *)pnga_malloc(nprocs, MT_F_INT, "ga_gat_header");
      list =(Integer *)pnga_malloc(nv, MT_F_INT, "ga_gat_list");
      nelems =(Integer *)pnga_malloc(nprocs, MT_F_INT, "ga_gat_nelems");
    } else {
      if (GA_prealloc_gatscat < nv)
        pnga_error("Gather/scatter vector exceeds allocation length ",
                   GA_prealloc_gatscat);
      header = (Integer*)GA_header;
      list = (Integer*)GA_list;
      nelems = (Integer*)GA_elems;
    }

    ndim = GA[handle].ndim;
    type = GA[handle].type;
    item_size = GA[handle].elemsize;
    *totbytes = item_size * nv;

    /* Initialize linked list data structures */
    for (i=0; i<nprocs; i++) {
      nelems[i] = 0;
      header[i] = -1;
    }
    for (i=0; i<nv; i++) {
      list[i] = 0;
    }

    /* Set up linked list that partitions elements defined in subscripts array
     * into groups corresponding to the elements home processor
     */
    maxlen = 1;
    for (i=0; i<nv; i++) {
      if (c_flag) {
        gam_c2f_index(((int**)subscript)[i], index, ndim);
        subscript_ptr = index;
      } else {
        subscript_ptr = ((Integer*)subscript)+i*ndim;
      }
      if(!pnga_locate(g_a, subscript_ptr, &idx)) {
        gai_print_subscript("invalid subscript",ndim, subscript_ptr,"\n");
        pnga_error("failed -element:",i);
      }
      if (num_rstrctd > 0) idx = GA[handle].rank_rstrctd[idx];
      /* map from block to processor, if necessary */
      if (GA[handle].distr_type == BLOCK_CYCLIC) {
        idx = idx%nprocs;
      } else if (GA[handle].distr_type == SCALAPACK) {
        gam_find_block_indices(handle,idx,index);
        for (j=0; j<ndim; j++) {
          index[j] = index[j]%nblock[j];
        }
        gam_find_proc_from_sl_indices(handle,idx,index);
      } else if (GA[handle].distr_type == TILED ||
          GA[handle].distr_type == TILED_IRREG) {
        gam_find_block_indices(handle,idx,index);
        for (j=0; j<ndim; j++) {
          index[j] = index[j]%nblock[j];
        }
        gam_find_tile_proc_from_indices(handle,idx,index);
      }
      nelems[idx]++;
      if (maxlen<nelems[idx]) maxlen=nelems[idx];
      j = header[idx];
      header[idx] = i;
      list[i] = j;
    }
    *locbytes = item_size * nelems[me];

    /* allocate buffers for individual vector calls */
    buf = (char*)malloc(2*maxlen*sizeof(void*));
    ptr_loc = (void**)buf;
    ptr_rem = (void**)(buf+maxlen*sizeof(void*));

    for (iproc=0; iproc<nprocs; iproc++) {
      if (nelems[iproc] > 0) {
        /* loop through linked list to find all data elements associated with
         * the remote processor iproc
         */
        idx = header[iproc];
        j = 0;
        while (idx > -1) {
          if (c_flag) {
            gam_c2f_index(((int**)subscript)[idx], index, ndim);
            subscript_ptr = index;
          } else {
            subscript_ptr = ((Integer*)subscript)+idx*ndim;
          }
          if (GA[handle].distr_type == REGULAR) {
          /* gam_Loc_ptr modifies the value of the processor variable for
           * restricted arrays or processor groups, so make a temporary copy
           */
            tproc = iproc;
            gam_Loc_ptr(tproc, handle,  (subscript_ptr),
                ptr_rem+j);
          } else {
            /* TODO: Figure out how to get correct pointers for block cyclic
             * distributions */
            /* find block index from subscript */
            if(!pnga_locate(g_a, subscript_ptr, &tproc)) {
              gai_print_subscript("invalid subscript for block-cyclic array",
                                   ndim, subscript_ptr,"\n");
              pnga_error("failed -element:",idx);
            }
            pnga_distribution(g_a, tproc, lo, hi);
            pnga_access_block_ptr(g_a, tproc, ptr_rem+j, ld);
            pnga_release_block(g_a, tproc);
            offset = 0;
            last = ndim -1;
            jtot = 1;
            for (k=0; k<last; k++) {
              offset += ((subscript_ptr)[k]-lo[k])*jtot;
              jtot *= ld[k];
            }
            offset += ((subscript_ptr)[last]-lo[last])*jtot;
            ptr_rem[j] = (void*)(((char*)ptr_rem[j])+offset*item_size);
          }
          ptr_loc[j] = (void*)(((char*)v) + idx * item_size);
          idx = list[idx];
          j++;
        }
        /* correct remote proc if restricted arrays or processor groups are
         * being used
         */
        if (num_rstrctd > 0) {
          tproc = GA[handle].rstrctd_list[iproc];
        } else {
          if (p_handle < 0) {
            tproc = iproc;
          } else {
            tproc = PGRP_LIST[p_handle].inv_map_proc_list[iproc];
          }
        }
        /* perform vector operation */
        switch(op) { 
          case GATHER:
            desc.bytes = (int)item_size;
            desc.src_ptr_array = ptr_rem;
            desc.dst_ptr_array = ptr_loc;
            desc.ptr_array_len = (int)nelems[iproc];
            rc=ARMCI_GetV(&desc, 1, (int)tproc);
            if(rc) pnga_error("gather failed in armci",rc);
            break;
          case SCATTER:
            desc.bytes = (int)item_size;
            desc.src_ptr_array = ptr_loc;
            desc.dst_ptr_array = ptr_rem;
            desc.ptr_array_len = (int)nelems[iproc];
            rc=ARMCI_PutV(&desc, 1, (int)tproc);
            if(rc) pnga_error("scatter failed in armci",rc);
            break;
          case SCATTER_ACC:
            desc.bytes = (int)item_size;
            desc.src_ptr_array = ptr_loc;
            desc.dst_ptr_array = ptr_rem;
            desc.ptr_array_len = (int)nelems[iproc];
            if(alpha != NULL) {
              int optype=-1;
              if(type==C_DBL) optype= ARMCI_ACC_DBL;
              else if(type==C_DCPL)optype= ARMCI_ACC_DCP;
              else if(type==C_SCPL)optype= ARMCI_ACC_CPL;
              else if(type==C_INT)optype= ARMCI_ACC_INT;
              else if(type==C_LONG)optype= ARMCI_ACC_LNG;
              else if(type==C_FLOAT)optype= ARMCI_ACC_FLT; 
              else pnga_error("type not supported",type);
              rc= ARMCI_AccV(optype, alpha, &desc, 1, (int)tproc);
            }
            if(rc) pnga_error("scatter_acc failed in armci",rc);
            break;
          default: pnga_error("operation not supported",op);
        }
      }
    }
    free(buf);
    if (!GA_prealloc_gatscat) {
      pnga_free(nelems);
      pnga_free(list);
      pnga_free(header);
    }

}